

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::update(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,int p_col,
        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *p_work,int *p_idx,int num)

{
  pointer pnVar1;
  bool bVar2;
  uint uVar3;
  fpclass_type fVar4;
  undefined8 uVar5;
  int32_t iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  uint *puVar12;
  int iVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  pointer pnVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  uint *puVar17;
  int *piVar18;
  int32_t *piVar19;
  fpclass_type *pfVar20;
  byte bVar21;
  byte bVar22;
  cpp_dec_float<200U,_int,_void> uu;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_228;
  uint local_1a8 [28];
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar22 = 0;
  local_1a8[0x18] = 0;
  local_1a8[0x19] = 0;
  local_1a8[0x1a] = 0;
  local_1a8[0x14] = 0;
  local_1a8[0x15] = 0;
  local_1a8[0x16] = 0;
  local_1a8[0x17] = 0;
  local_1a8[0x10] = 0;
  local_1a8[0x11] = 0;
  local_1a8[0x12] = 0;
  local_1a8[0x13] = 0;
  local_1a8[0xc] = 0;
  local_1a8[0xd] = 0;
  local_1a8[0xe] = 0;
  local_1a8[0xf] = 0;
  local_1a8[8] = 0;
  local_1a8[9] = 0;
  local_1a8[10] = 0;
  local_1a8[0xb] = 0;
  local_1a8[4] = 0;
  local_1a8[5] = 0;
  local_1a8[6] = 0;
  local_1a8[7] = 0;
  local_1a8[0] = 0;
  local_1a8[1] = 0;
  local_1a8[2] = 0;
  local_1a8[3] = 0;
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 0x1c;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_228,1,(type *)0x0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_b8,&local_228,&p_work[p_col].m_backend);
  pcVar11 = &local_b8;
  pcVar14 = &local_138;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar22 * -8 + 4);
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_138.exp = local_b8.exp;
  local_138.neg = local_b8.neg;
  local_138.fpclass = local_b8.fpclass;
  local_138.prec_elem = local_b8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&p_work[p_col].m_backend,0.0);
  iVar7 = makeLvec(this,num,p_col);
  pnVar1 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar18 = (this->l).idx;
  iVar13 = p_idx[(long)num + -1];
  if (iVar13 != p_col) {
    piVar10 = piVar18 + iVar7;
    pfVar20 = &pnVar1[iVar7].m_backend.fpclass;
    lVar8 = 0;
    do {
      *piVar10 = iVar13;
      pcVar14 = &p_work[iVar13].m_backend;
      local_228.fpclass = cpp_dec_float_finite;
      local_228.prec_elem = 0x1c;
      local_228.data._M_elems[0] = 0;
      local_228.data._M_elems[1] = 0;
      local_228.data._M_elems[2] = 0;
      local_228.data._M_elems[3] = 0;
      local_228.data._M_elems[4] = 0;
      local_228.data._M_elems[5] = 0;
      local_228.data._M_elems[6] = 0;
      local_228.data._M_elems[7] = 0;
      local_228.data._M_elems[8] = 0;
      local_228.data._M_elems[9] = 0;
      local_228.data._M_elems[10] = 0;
      local_228.data._M_elems[0xb] = 0;
      local_228.data._M_elems[0xc] = 0;
      local_228.data._M_elems[0xd] = 0;
      local_228.data._M_elems[0xe] = 0;
      local_228.data._M_elems[0xf] = 0;
      local_228.data._M_elems[0x10] = 0;
      local_228.data._M_elems[0x11] = 0;
      local_228.data._M_elems[0x12] = 0;
      local_228.data._M_elems[0x13] = 0;
      local_228.data._M_elems[0x14] = 0;
      local_228.data._M_elems[0x15] = 0;
      local_228.data._M_elems[0x16] = 0;
      local_228.data._M_elems[0x17] = 0;
      local_228.data._M_elems[0x18] = 0;
      local_228.data._M_elems[0x19] = 0;
      local_228.data._M_elems._104_5_ = 0;
      local_228.data._M_elems[0x1b]._1_3_ = 0;
      local_228.exp = 0;
      local_228.neg = false;
      pcVar11 = &local_138;
      if (&local_228 != pcVar14) {
        pcVar16 = &local_228;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar16->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar22 * -8 + 4);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4);
        }
        local_228.exp = local_138.exp;
        local_228.neg = local_138.neg;
        local_228.fpclass = local_138.fpclass;
        local_228.prec_elem = local_138.prec_elem;
        pcVar11 = pcVar14;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_228,pcVar11);
      pcVar11 = &local_228;
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)(pfVar20 + -0x1e);
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pcVar16->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar22 * -8 + 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      pfVar20[-2] = local_228.exp;
      *(bool *)(pfVar20 + -1) = local_228.neg;
      *(undefined8 *)pfVar20 = local_228._120_8_;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)pcVar14,0.0);
      iVar13 = p_idx[(long)num + lVar8 + -2];
      piVar10 = piVar10 + 1;
      pfVar20 = pfVar20 + 0x20;
      lVar8 = lVar8 + -1;
    } while (iVar13 != p_col);
    iVar7 = iVar7 - (int)lVar8;
    num = num + (int)lVar8;
  }
  lVar9 = (long)iVar7;
  piVar18[lVar9] = p_col;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_228,1,(type *)0x0);
  pcVar11 = &local_138;
  pcVar14 = &local_b8;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar22 * -2 + 1) * 4);
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4);
  }
  local_b8.exp = local_138.exp;
  local_b8.neg = local_138.neg;
  local_b8.fpclass = local_138.fpclass;
  local_b8.prec_elem = local_138.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_b8,&local_228);
  if (local_b8.data._M_elems[0] != 0 || local_b8.fpclass != cpp_dec_float_finite) {
    local_b8.neg = (bool)(local_b8.neg ^ 1);
  }
  pcVar11 = &local_b8;
  pnVar15 = pnVar1 + lVar9;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pnVar15->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar22 * -8 + 4);
    pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  pnVar1[lVar9].m_backend.exp = local_b8.exp;
  pnVar1[lVar9].m_backend.neg = local_b8.neg;
  pnVar1[lVar9].m_backend.fpclass = local_b8.fpclass;
  pnVar1[lVar9].m_backend.prec_elem = local_b8.prec_elem;
  if (1 < num) {
    piVar18 = piVar18 + lVar9;
    piVar19 = &pnVar1[lVar9 + 1].m_backend.prec_elem;
    lVar8 = (ulong)(num - 2) + 1;
    do {
      piVar18 = piVar18 + 1;
      iVar13 = p_idx[lVar8 + -1];
      *piVar18 = iVar13;
      pcVar14 = &p_work[iVar13].m_backend;
      local_228.fpclass = cpp_dec_float_finite;
      local_228.prec_elem = 0x1c;
      local_228.data._M_elems[0] = 0;
      local_228.data._M_elems[1] = 0;
      local_228.data._M_elems[2] = 0;
      local_228.data._M_elems[3] = 0;
      local_228.data._M_elems[4] = 0;
      local_228.data._M_elems[5] = 0;
      local_228.data._M_elems[6] = 0;
      local_228.data._M_elems[7] = 0;
      local_228.data._M_elems[8] = 0;
      local_228.data._M_elems[9] = 0;
      local_228.data._M_elems[10] = 0;
      local_228.data._M_elems[0xb] = 0;
      local_228.data._M_elems[0xc] = 0;
      local_228.data._M_elems[0xd] = 0;
      local_228.data._M_elems[0xe] = 0;
      local_228.data._M_elems[0xf] = 0;
      local_228.data._M_elems[0x10] = 0;
      local_228.data._M_elems[0x11] = 0;
      local_228.data._M_elems[0x12] = 0;
      local_228.data._M_elems[0x13] = 0;
      local_228.data._M_elems[0x14] = 0;
      local_228.data._M_elems[0x15] = 0;
      local_228.data._M_elems[0x16] = 0;
      local_228.data._M_elems[0x17] = 0;
      local_228.data._M_elems[0x18] = 0;
      local_228.data._M_elems[0x19] = 0;
      local_228.data._M_elems._104_5_ = 0;
      local_228.data._M_elems[0x1b]._1_3_ = 0;
      local_228.exp = 0;
      local_228.neg = false;
      pcVar11 = &local_138;
      if (&local_228 != pcVar14) {
        pcVar16 = &local_228;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar16->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar22 * -8 + 4);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4);
        }
        local_228.exp = local_138.exp;
        local_228.neg = local_138.neg;
        local_228.fpclass = local_138.fpclass;
        local_228.prec_elem = local_138.prec_elem;
        pcVar11 = pcVar14;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_228,pcVar11);
      uVar5 = local_228._120_8_;
      bVar21 = local_228.neg;
      iVar13 = local_228.exp;
      uVar3 = local_228.data._M_elems[0];
      puVar12 = local_228.data._M_elems + 1;
      puVar17 = local_1a8;
      for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar17 = *puVar12;
        puVar12 = puVar12 + (ulong)bVar22 * -2 + 1;
        puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
      }
      fVar4 = local_228.fpclass;
      iVar6 = local_228.prec_elem;
      (((cpp_dec_float<200U,_int,_void> *)(piVar19 + -0x1f))->data)._M_elems[0] =
           local_228.data._M_elems[0];
      puVar12 = local_1a8;
      puVar17 = (uint *)(piVar19 + -0x1e);
      for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar17 = *puVar12;
        puVar12 = puVar12 + (ulong)bVar22 * -2 + 1;
        puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
      }
      piVar19[-3] = local_228.exp;
      *(bool *)(piVar19 + -2) = local_228.neg;
      piVar19[-1] = local_228.fpclass;
      *piVar19 = local_228.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)pcVar14,0.0);
      puVar12 = local_1a8;
      puVar17 = local_228.data._M_elems + 1;
      for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar17 = *puVar12;
        puVar12 = puVar12 + (ulong)bVar22 * -2 + 1;
        puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
      }
      local_228.data._M_elems._0_8_ = CONCAT44(local_228.data._M_elems[1],uVar3);
      local_228.neg = (bool)bVar21;
      if (((bool)bVar21 == true) && (fVar4 != cpp_dec_float_finite || uVar3 != 0)) {
        local_228.neg = false;
      }
      if (((fVar4 != cpp_dec_float_NaN) && ((this->maxabs).m_backend.fpclass != cpp_dec_float_NaN))
         && (local_228.exp = iVar13, local_228._120_8_ = uVar5,
            iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_228,&(this->maxabs).m_backend), 0 < iVar7)) {
        if ((bool)bVar21 != false) {
          bVar21 = bVar21 ^ (fVar4 != cpp_dec_float_finite || uVar3 != 0);
        }
        (this->maxabs).m_backend.data._M_elems[0] = uVar3;
        puVar12 = local_1a8;
        puVar17 = (this->maxabs).m_backend.data._M_elems + 1;
        for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar17 = *puVar12;
          puVar12 = puVar12 + (ulong)bVar22 * -2 + 1;
          puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
        }
        (this->maxabs).m_backend.exp = iVar13;
        (this->maxabs).m_backend.neg = (bool)bVar21;
        (this->maxabs).m_backend.fpclass = fVar4;
        (this->maxabs).m_backend.prec_elem = iVar6;
      }
      piVar19 = piVar19 + 0x20;
      lVar9 = lVar8 + -1;
      bVar2 = 0 < lVar8;
      lVar8 = lVar9;
    } while (lVar9 != 0 && bVar2);
  }
  this->stat = OK;
  return;
}

Assistant:

void CLUFactor<R>::update(int p_col, R* p_work, const int* p_idx, int num)
{
   int ll, i, j;
   int* lidx;
   R* lval;
   R x, rezi;

   assert(p_work[p_col] != 0.0);
   rezi = 1 / p_work[p_col];
   p_work[p_col] = 0.0;

   ll = makeLvec(num, p_col);
   //   ll = fac->makeLvec(num, col);
   lval = l.val.data();
   lidx = l.idx;

   for(i = num - 1; (j = p_idx[i]) != p_col; --i)
   {
      lidx[ll] = j;
      lval[ll] = rezi * p_work[j];
      p_work[j] = 0.0;
      ++ll;
   }

   lidx[ll] = p_col;

   lval[ll] = 1 - rezi;
   ++ll;

   for(--i; i >= 0; --i)
   {
      j = p_idx[i];
      lidx[ll] = j;
      lval[ll] = x = rezi * p_work[j];
      p_work[j] = 0.0;
      ++ll;

      if(spxAbs(x) > maxabs)
         maxabs = spxAbs(x);
   }

   this->stat = SLinSolver<R>::OK;
}